

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::clear(SVSetBase<double> *this,int minNewSize)

{
  int iVar1;
  int in_ESI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  IsList<soplex::SVSetBase<double>::DLPSV> *unaff_retaddr;
  ClassArray<soplex::Nonzero<double>_> *in_stack_00000018;
  ClassArray<soplex::Nonzero<double>_> *pCVar2;
  undefined1 pDestroyElements;
  
  pCVar2 = in_RDI;
  ClassArray<soplex::Nonzero<double>_>::clear(in_RDI);
  pDestroyElements = (undefined1)((ulong)pCVar2 >> 0x38);
  if (in_ESI < 1) {
    iVar1 = ClassArray<soplex::Nonzero<double>_>::max(in_RDI);
    if (10000 < iVar1) {
      ClassArray<soplex::Nonzero<double>_>::reMax(in_stack_00000018,this._4_4_,(int)this);
    }
  }
  else {
    iVar1 = ClassArray<soplex::Nonzero<double>_>::max(in_RDI);
    if (in_ESI + 10000 < iVar1) {
      ClassArray<soplex::Nonzero<double>_>::reMax(in_stack_00000018,this._4_4_,(int)this);
    }
  }
  ClassSet<soplex::SVSetBase<double>::DLPSV>::clear
            ((ClassSet<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 1));
  IsList<soplex::SVSetBase<double>::DLPSV>::clear(unaff_retaddr,(bool)pDestroyElements);
  *(undefined4 *)&in_RDI[2].memFactor = 0;
  *(undefined4 *)((long)&in_RDI[2].memFactor + 4) = 0;
  return;
}

Assistant:

void clear(int minNewSize = -1)
   {
      SVSetBaseArray::clear();

      if(minNewSize <= 0)
      {
         if(SVSetBaseArray::max() > 10000)
            SVSetBaseArray::reMax(10000);
      }
      else
      {
         if(SVSetBaseArray::max() > minNewSize + 10000)
            SVSetBaseArray::reMax(minNewSize);
      }

      set.clear();
      list.clear();
      unusedMem = 0;
      numUnusedMemUpdates = 0;
   }